

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# measunit.cpp
# Opt level: O0

MeasureUnit *
icu_63::MeasureUnit::resolveUnitPerUnit
          (MeasureUnit *__return_storage_ptr__,MeasureUnit *unit,MeasureUnit *perUnit,
          bool *isResolved)

{
  int32_t iVar1;
  int32_t iVar2;
  int iVar3;
  long lVar4;
  int32_t *midRow;
  int local_38;
  int32_t mid;
  int32_t end;
  int32_t start;
  int32_t perUnitOffset;
  int32_t unitOffset;
  bool *isResolved_local;
  MeasureUnit *perUnit_local;
  MeasureUnit *unit_local;
  
  iVar1 = getOffset(unit);
  iVar2 = getOffset(perUnit);
  mid = 0;
  local_38 = 8;
  iVar3 = local_38;
  while( true ) {
    do {
      while( true ) {
        do {
          local_38 = iVar3;
          if (local_38 <= mid) {
            *isResolved = false;
            MeasureUnit(__return_storage_ptr__);
            return __return_storage_ptr__;
          }
          iVar3 = (mid + local_38) / 2;
          lVar4 = (long)iVar3 * 0x10;
        } while (iVar1 < *(int *)(unitPerUnitToSingleUnit + lVar4));
        if (iVar1 <= *(int *)(unitPerUnitToSingleUnit + lVar4)) break;
        mid = iVar3 + 1;
        iVar3 = local_38;
      }
    } while (iVar2 < *(int *)(unitPerUnitToSingleUnit + lVar4 + 4));
    if (iVar2 <= *(int *)(unitPerUnitToSingleUnit + lVar4 + 4)) break;
    mid = iVar3 + 1;
    iVar3 = local_38;
  }
  *isResolved = true;
  MeasureUnit(__return_storage_ptr__,*(int32_t *)(unitPerUnitToSingleUnit + lVar4 + 8),
              *(int32_t *)(unitPerUnitToSingleUnit + lVar4 + 0xc));
  return __return_storage_ptr__;
}

Assistant:

MeasureUnit MeasureUnit::resolveUnitPerUnit(
        const MeasureUnit &unit, const MeasureUnit &perUnit, bool* isResolved) {
    int32_t unitOffset = unit.getOffset();
    int32_t perUnitOffset = perUnit.getOffset();

    // binary search for (unitOffset, perUnitOffset)
    int32_t start = 0;
    int32_t end = UPRV_LENGTHOF(unitPerUnitToSingleUnit);
    while (start < end) {
        int32_t mid = (start + end) / 2;
        int32_t *midRow = unitPerUnitToSingleUnit[mid];
        if (unitOffset < midRow[0]) {
            end = mid;
        } else if (unitOffset > midRow[0]) {
            start = mid + 1;
        } else if (perUnitOffset < midRow[1]) {
            end = mid;
        } else if (perUnitOffset > midRow[1]) {
            start = mid + 1;
        } else {
            // We found a resolution for our unit / per-unit combo
            // return it.
            *isResolved = true;
            return MeasureUnit(midRow[2], midRow[3]);
        }
    }

    *isResolved = false;
    return MeasureUnit();
}